

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O0

int gate_segment_mix(mixed_segment *segment)

{
  float fVar1;
  uint local_6c;
  float sample_1;
  uint32_t i_1;
  float sample;
  uint32_t i;
  float *out;
  float *in;
  mixed_buffer *__out;
  mixed_buffer *__in;
  float local_38;
  uint32_t samples;
  float volume;
  float release;
  float hold;
  float attack;
  float close;
  float open;
  float time;
  float stime;
  gate_segment_data *data;
  mixed_segment *segment_local;
  
  _time = (undefined8 *)segment->data;
  open = (float)(1.0 / (double)*(uint *)((long)_time + 0x24));
  close = *(float *)(_time + 5);
  attack = *(float *)((long)_time + 0x14);
  hold = *(float *)(_time + 2);
  release = *(float *)(_time + 3);
  volume = *(float *)((long)_time + 0x1c);
  samples = *(uint32_t *)(_time + 4);
  local_38 = 1.0;
  __in._4_4_ = 0xffffffff;
  __out = (mixed_buffer *)*_time;
  in = (float *)_time[1];
  data = (gate_segment_data *)segment;
  if (__out == (mixed_buffer *)in) {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    for (i_1 = 0; i_1 < __in._4_4_; i_1 = i_1 + 1) {
      fVar1 = out[i_1];
      switch(*(undefined4 *)((long)_time + 0x2c)) {
      case 1:
        local_38 = 0.0;
        if (attack <= fVar1) {
          close = 0.0;
          *(undefined4 *)((long)_time + 0x2c) = 2;
        }
        break;
      case 2:
        if (close <= release) {
          local_38 = close / release;
          close = open + close;
        }
        else {
          *(undefined4 *)((long)_time + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar1 < hold) {
          close = volume;
          *(undefined4 *)((long)_time + 0x2c) = 4;
        }
        break;
      case 4:
        if (fVar1 < attack) {
          if (0.0 < close) {
            close = close - open;
          }
          else {
            close = (float)samples;
            *(undefined4 *)((long)_time + 0x2c) = 5;
          }
        }
        else {
          *(undefined4 *)((long)_time + 0x2c) = 3;
        }
        break;
      case 5:
        if (fVar1 < attack) {
          if (0.0 < close) {
            local_38 = close / (float)samples;
            close = close - open;
          }
          else {
            local_38 = 0.0;
            close = 0.0;
            *(undefined4 *)((long)_time + 0x2c) = 1;
          }
        }
        else {
          local_38 = close / (float)samples;
          close = (close / (float)samples) * release;
          *(undefined4 *)((long)_time + 0x2c) = 2;
        }
      }
      out[i_1] = fVar1 * local_38;
    }
  }
  else {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    mixed_buffer_request_write((float **)&sample,(uint32_t *)((long)&__in + 4),(mixed_buffer *)in);
    for (local_6c = 0; local_6c < __in._4_4_; local_6c = local_6c + 1) {
      fVar1 = out[local_6c];
      switch(*(undefined4 *)((long)_time + 0x2c)) {
      case 1:
        local_38 = 0.0;
        if (attack <= fVar1) {
          close = 0.0;
          *(undefined4 *)((long)_time + 0x2c) = 2;
        }
        break;
      case 2:
        if (close <= release) {
          local_38 = close / release;
          close = open + close;
        }
        else {
          *(undefined4 *)((long)_time + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar1 < hold) {
          close = volume;
          *(undefined4 *)((long)_time + 0x2c) = 4;
        }
        break;
      case 4:
        if (fVar1 < attack) {
          if (0.0 < close) {
            close = close - open;
          }
          else {
            close = (float)samples;
            *(undefined4 *)((long)_time + 0x2c) = 5;
          }
        }
        else {
          *(undefined4 *)((long)_time + 0x2c) = 3;
        }
        break;
      case 5:
        if (fVar1 < attack) {
          if (0.0 < close) {
            local_38 = close / (float)samples;
            close = close - open;
          }
          else {
            local_38 = 0.0;
            close = 0.0;
            *(undefined4 *)((long)_time + 0x2c) = 1;
          }
        }
        else {
          local_38 = close / (float)samples;
          close = (close / (float)samples) * release;
          *(undefined4 *)((long)_time + 0x2c) = 2;
        }
      }
      _sample[local_6c] = fVar1 * local_38;
    }
    mixed_buffer_finish_read(__in._4_4_,__out);
    mixed_buffer_finish_write(__in._4_4_,(mixed_buffer *)in);
  }
  *(float *)(_time + 5) = close;
  return 1;
}

Assistant:

VECTORIZE int gate_segment_mix(struct mixed_segment *segment){
  struct gate_segment_data *data = (struct gate_segment_data *)segment->data;

  float stime = 1.0/data->samplerate;
  float time = data->time;
  float open = data->open_threshold;
  float close = data->close_threshold;
  float attack = data->attack;
  float hold = data->hold;
  float release = data->release;
  float volume = 1.0;
  
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float sample = in[i];
      switch(data->state){
      case CLOSED:
        volume = 0.0;
        if(open <= sample){
          time = 0.0;
          data->state = ATTACKING;
        }
        break;
      case ATTACKING:
        if(attack < time){
          data->state = OPEN;
        }else{
          volume = time/attack;
          time += stime;
        }
        break;
      case OPEN:
        if(sample < close){
          time = hold;
          data->state = HOLDING;
        }
        break;
      case HOLDING:
        if(open <= sample){
          data->state = OPEN;
        }else if(time <= 0){
          time = release;
          data->state = RELEASING;
        }else{
          time -= stime;
        }
        break;
      case RELEASING:
        if(open <= sample){
          volume = time/release;
          time = time/release*attack;
          data->state = ATTACKING;
        }else if(time <= 0){
          volume = 0.0;
          time = 0.0;
          data->state = CLOSED;
        }else{
          volume = time/release;
          time -= stime;
        }
        break;
      }
      out[i] = sample * volume;
    })
  data->time = time;
  return 1;
}